

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarConcat::add_sink(VarConcat *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  bool bVar1;
  reference ppVVar2;
  Var **var;
  iterator __end1;
  iterator __begin1;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range1;
  shared_ptr<kratos::AssignStmt> *stmt_local;
  VarConcat *this_local;
  
  __end1 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin(&this->vars_);
  var = (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end(&this->vars_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                                *)&var);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
              ::operator*(&__end1);
    (*((*ppVVar2)->super_IRNode)._vptr_IRNode[0x15])(*ppVVar2,stmt);
    __gnu_cxx::
    __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void VarConcat::add_sink(const std::shared_ptr<kratos::AssignStmt> &stmt) {
    for (auto &var : vars_) {
        var->add_sink(stmt);
    }
}